

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_yoda_tests.cpp
# Opt level: O0

void __thiscall iu_NoYodaTest_x_iutest_x_StrEq_Test::Body(iu_NoYodaTest_x_iutest_x_StrEq_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_3f8;
  Fixed local_3c8;
  anon_class_1_0_00000001 local_239;
  undefined1 local_238 [8];
  AssertionResult iutest_spi_ar_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_spi_ar;
  iu_NoYodaTest_x_iutest_x_StrEq_Test *this_local;
  
  iutest_spi_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
               ,0x4e,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_spi_ar_1._37_3_ = 0;
  iutest_spi_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_spi_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_238,&local_239);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                (&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
                 ,0x4f,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_3f8,&local_3c8);
      iutest::AssertionHelper::~AssertionHelper(&local_3f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest_spi_ar_1._37_3_ = 0;
    iutest_spi_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  }
  return;
}

Assistant:

IUTEST(NoYodaTest, StrEq)
{
    IUTEST_ASSERT_FATAL_FAILURE   ( IUTEST_ASSERT_STREQ(gx, "hoge"), "Expected: \"hoge\"" );
    IUTEST_ASSERT_NONFATAL_FAILURE( IUTEST_EXPECT_STREQ(gx, "hoge"), "Expected: \"hoge\"" );
}